

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.h
# Opt level: O0

void __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setDelta(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *newDelta)

{
  type_conflict5 tVar1;
  element_type *peVar2;
  double in_RDI;
  SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffff38;
  cpp_dec_float<50U,_int,_void> *in_stack_ffffffffffffff40;
  undefined1 local_88 [56];
  Real local_50;
  cpp_dec_float<50U,_int,_void> *in_stack_ffffffffffffffc8;
  
  SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::tolerances(in_stack_ffffffffffffff38);
  peVar2 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x3cbbd2);
  local_50 = Tolerances::epsilon(peVar2);
  tVar1 = boost::multiprecision::operator<=
                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)in_stack_ffffffffffffff38,(double *)0x3cbbfd);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x3cbc0d);
  if (tVar1) {
    in_stack_ffffffffffffff40 = (cpp_dec_float<50U,_int,_void> *)local_88;
    SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::tolerances(in_stack_ffffffffffffff38);
    peVar2 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x3cbc38);
    local_88._16_8_ = Tolerances::epsilon(peVar2);
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              (in_stack_ffffffffffffffc8,in_RDI);
    std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x3cbca5);
  }
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
            (in_stack_ffffffffffffff40,(cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffff38);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
            (in_stack_ffffffffffffff40,(cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffff38);
  return;
}

Assistant:

virtual void setDelta(R newDelta)
   {
      if(newDelta <= this->tolerances()->epsilon())
         newDelta = this->tolerances()->epsilon();

      this->delta = newDelta;
      fastDelta = newDelta;
   }